

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::TemplateTemplateNode::ExpandOnce
          (TemplateTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,char *filename,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modifiers;
  bool bVar1;
  bool bVar2;
  TemplateAnnotator *pTVar3;
  string sub_template;
  StringEmitter subtemplate_buffer;
  undefined1 local_80 [32];
  ExpandEmitter local_60;
  undefined1 *local_58;
  TemplateString local_50;
  
  if (per_expand_data->annotate_path_ != (char *)0x0) {
    pTVar3 = PerExpandData::annotator(per_expand_data);
    TemplateToken::ToString_abi_cxx11_((string *)local_80,&this->token_);
    (*pTVar3->_vptr_TemplateAnnotator[2])(pTVar3,output_buffer,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
  }
  modifiers = &(this->token_).modvals;
  bVar1 = AnyMightModify(modifiers,per_expand_data);
  if (bVar1) {
    local_80._0_8_ = local_80 + 0x10;
    local_80._8_8_ = 0;
    local_80[0x10] = '\0';
    local_60._vptr_ExpandEmitter = (_func_int **)&PTR__ExpandEmitter_00153330;
    local_58 = local_80;
    TemplateString::TemplateString(&local_50,filename);
    bVar1 = TemplateCache::ExpandLocked
                      (cache,&local_50,this->strip_,&local_60,dictionary,per_expand_data);
    if (bVar1) {
      EmitModifiedString(modifiers,(char *)local_80._0_8_,local_80._8_8_,per_expand_data,
                         output_buffer);
    }
    else {
      EmitMissingInclude(filename,output_buffer,per_expand_data);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    TemplateString::TemplateString((TemplateString *)local_80,filename);
    bVar2 = TemplateCache::ExpandLocked
                      (cache,(TemplateString *)local_80,this->strip_,output_buffer,dictionary,
                       per_expand_data);
    bVar1 = true;
    if (!bVar2) {
      EmitMissingInclude(filename,output_buffer,per_expand_data);
      bVar1 = false;
    }
  }
  if (per_expand_data->annotate_path_ != (char *)0x0) {
    pTVar3 = PerExpandData::annotator(per_expand_data);
    (*pTVar3->_vptr_TemplateAnnotator[3])(pTVar3,output_buffer);
  }
  return bVar1;
}

Assistant:

bool TemplateTemplateNode::ExpandOnce(
    ExpandEmitter *output_buffer,
    const TemplateDictionaryInterface &dictionary,
    const char* const filename,
    PerExpandData *per_expand_data,
    const TemplateCache *cache) const {
  bool error_free = true;
  // NOTE: Although we do this const_cast here, if the cache is frozen
  // the expansion doesn't mutate the cache, and is effectively 'const'.
  TemplateCache* cache_ptr = const_cast<TemplateCache*>(cache);

  // Expand the included template once for each "template specific"
  // dictionary.  Normally this will only iterate once, but it's
  // possible to supply a list of more than one sub-dictionary and
  // then the template explansion will be iterative, just as though
  // the included template were an iterated section.
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitOpenInclude(output_buffer,
                                                  token_.ToString());
  }
  // sub-dictionary NULL means 'just use the current dictionary instead'.
  // We force children to annotate the output if we have to.
  // If the include-template has modifiers, we need to expand to a string,
  // modify the string, and append to output_buffer.  Otherwise (common
  // case), we can just expand into the output-buffer directly.
  if (AnyMightModify(token_.modvals, per_expand_data)) {
    string sub_template;
    StringEmitter subtemplate_buffer(&sub_template);
    if (!cache_ptr->ExpandLocked(filename, strip_,
                                 &subtemplate_buffer,
                                 &dictionary,
                                 per_expand_data)) {
      EmitMissingInclude(filename, output_buffer, per_expand_data);
      error_free = false;
    } else {
      EmitModifiedString(token_.modvals,
                         sub_template.data(), sub_template.size(),
                         per_expand_data, output_buffer);
    }
  } else {
    // No need to modify sub-template
    if (!cache_ptr->ExpandLocked(filename, strip_,
                                 output_buffer,
                                 &dictionary,
                                 per_expand_data)) {
      EmitMissingInclude(filename, output_buffer, per_expand_data);
      error_free = false;
    }
  }
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitCloseInclude(output_buffer);
  }
  return error_free;
}